

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridLocalPolynomial.hpp
# Opt level: O1

Data2D<double> * __thiscall
TasGrid::GridLocalPolynomial::encodeSupportForGPU<2,(TasGrid::TypeOneDRule)40,double>
          (Data2D<double> *__return_storage_ptr__,GridLocalPolynomial *this,MultiIndexSet *work)

{
  int iVar1;
  pointer piVar2;
  size_t sVar3;
  pointer pdVar4;
  size_t sVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  uint uVar9;
  double dVar10;
  double dVar11;
  allocator_type local_19;
  
  sVar5 = (size_t)(this->super_BaseCanonicalGrid).num_dimensions;
  iVar1 = work->cache_num_indexes;
  __return_storage_ptr__->stride = sVar5;
  __return_storage_ptr__->num_strips = (long)iVar1;
  ::std::vector<double,_std::allocator<double>_>::vector
            (&__return_storage_ptr__->vec,(long)iVar1 * sVar5,&local_19);
  if (0 < work->cache_num_indexes) {
    lVar6 = 0;
    do {
      if (0 < (this->super_BaseCanonicalGrid).num_dimensions) {
        sVar5 = work->num_dimensions;
        piVar2 = (work->indexes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        sVar3 = __return_storage_ptr__->stride;
        pdVar4 = (__return_storage_ptr__->vec).super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        lVar7 = 0;
        do {
          iVar1 = piVar2[sVar5 * lVar6 + lVar7];
          dVar10 = 2.0;
          if (1 < iVar1) {
            dVar10 = 1.0;
            if (iVar1 != 2) {
              uVar9 = iVar1 - 1;
              iVar8 = 1;
              do {
                uVar9 = (int)uVar9 >> 1;
                iVar8 = iVar8 * 2;
              } while (1 < uVar9);
              dVar10 = (double)iVar8;
            }
            dVar10 = 1.0 / dVar10;
          }
          dVar11 = -2.0;
          if (1 < iVar1) {
            dVar11 = dVar10 * dVar10;
          }
          pdVar4[sVar3 * lVar6 + lVar7] = dVar11;
          lVar7 = lVar7 + 1;
        } while (lVar7 < (this->super_BaseCanonicalGrid).num_dimensions);
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < work->cache_num_indexes);
  }
  return __return_storage_ptr__;
}

Assistant:

Data2D<T> encodeSupportForGPU(const MultiIndexSet &work) const{
        Data2D<T> cpu_support(num_dimensions, work.getNumIndexes());
        for(int i=0; i<work.getNumIndexes(); i++){
            const int* p = work.getIndex(i);
            T *s = cpu_support.getStrip(i);
            for(int j=0; j<num_dimensions; j++){
                if (ord == 0){
                    s[j] = static_cast<T>(RuleLocal::getSupport<RuleLocal::erule::pwc>(p[j]));
                } else {
                    switch(crule) {
                        case rule_localp:
                            s[j] = static_cast<T>(RuleLocal::getSupport<RuleLocal::erule::localp>(p[j]));
                            break;
                        case rule_semilocalp:
                            s[j] = static_cast<T>(RuleLocal::getSupport<RuleLocal::erule::semilocalp>(p[j]));
                            break;
                        case rule_localp0:
                            s[j] = static_cast<T>(RuleLocal::getSupport<RuleLocal::erule::localp0>(p[j]));
                            break;
                        case rule_localpb:
                            s[j] = static_cast<T>(RuleLocal::getSupport<RuleLocal::erule::localpb>(p[j]));
                            break;
                    };
                    if (ord == 2) s[j] *= s[j];
                    if ((crule == rule_localp) || (crule == rule_semilocalp)) if (p[j] == 0) s[j] = static_cast<T>(-1.0); // constant function
                    if ((crule == rule_localp) && (ord == 2)){
                        if (p[j] == 1) s[j] = static_cast<T>(-2.0);
                        else if (p[j] == 2) s[j] = static_cast<T>(-3.0);
                    }
                    if ((crule == rule_semilocalp) && (ord == 2)){
                        if (p[j] == 1) s[j] = static_cast<T>(-4.0);
                        else if (p[j] == 2) s[j] = static_cast<T>(-5.0);
                    }
                    if ((crule == rule_localpb) && (ord == 2)){
                        if (p[j] < 2) s[j] = static_cast<T>(-2.0); // linear functions on level 0
                    }
                }
            }
        }
        return cpu_support;
    }